

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O0

void __thiscall FFT_Benchmark1e4_Test::TestBody(FFT_Benchmark1e4_Test *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  vector<long_long,_std::allocator<long_long>_> want;
  vector<long_long,_std::allocator<long_long>_> res;
  int local_68;
  int j_1;
  int j;
  vector<long_long,_std::allocator<long_long>_> p2;
  allocator<long_long> local_31;
  undefined1 local_30 [8];
  vector<long_long,_std::allocator<long_long>_> p1;
  int range;
  int n;
  FFT_Benchmark1e4_Test *this_local;
  
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 10000;
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 100000;
  std::allocator<long_long>::allocator(&local_31);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_30,10000,&local_31);
  std::allocator<long_long>::~allocator(&local_31);
  sVar3 = (size_type)
          p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<long_long>::allocator((allocator<long_long> *)((long)&j_1 + 3));
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&j,sVar3,
             (allocator<long_long> *)((long)&j_1 + 3));
  std::allocator<long_long>::~allocator((allocator<long_long> *)((long)&j_1 + 3));
  for (local_68 = 0;
      sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size
                        ((vector<long_long,_std::allocator<long_long>_> *)local_30),
      (ulong)(long)local_68 < sVar3; local_68 = local_68 + 1) {
    iVar2 = rand();
    iVar2 = iVar2 % ((int)p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage << 1) -
            (int)p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    pvVar4 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       ((vector<long_long,_std::allocator<long_long>_> *)local_30,(long)local_68);
    *pvVar4 = (long)iVar2;
  }
  for (res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage._4_4_ = 0;
      sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size
                        ((vector<long_long,_std::allocator<long_long>_> *)&j),
      (ulong)(long)res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ < sVar3;
      res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    iVar2 = rand();
    iVar2 = iVar2 % ((int)p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage << 1) -
            (int)p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    pvVar4 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       ((vector<long_long,_std::allocator<long_long>_> *)&j,
                        (long)res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
    *pvVar4 = (long)iVar2;
  }
  multiplyPolynomials((vector<long_long,_std::allocator<long_long>_> *)
                      &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (vector<long_long,_std::allocator<long_long>_> *)local_30,
                      (vector<long_long,_std::allocator<long_long>_> *)&j);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)local_30,10);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)&j,10);
  multiplyNaive((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,
                (vector<long_long,_std::allocator<long_long>_> *)local_30,
                (vector<long_long,_std::allocator<long_long>_> *)&j);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,10);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,10);
  testing::internal::EqHelper<false>::
  Compare<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((EqHelper<false> *)local_b0,"want","res",
             (vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,
             (vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/numerical/fft_test.cpp"
               ,0x44,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)&j);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_30);
  return;
}

Assistant:

TEST(FFT, Benchmark1e4) {
    int n = 1e4;
    int range = 1e5; //numbers from -range to range
    vector<ll> p1(n), p2(n);
    rep(j, 0, p1.size()) p1[j] = rand() % (2 * range) - range;
    rep(j, 0, p2.size()) p2[j] = rand() % (2 * range) - range;
    vector<ll> res = multiplyPolynomials(p1, p2);
    p1.resize(10), p2.resize(10);
    vector<ll> want = multiplyNaive(p1, p2);
    want.resize(10), res.resize(10);
    EXPECT_EQ(want, res);
}